

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FSingleLumpFont::LoadFON1(FSingleLumpFont *this,int lump,BYTE *data)

{
  ushort uVar1;
  ushort uVar2;
  CharData *pCVar3;
  BYTE *pBVar4;
  long lVar5;
  
  pCVar3 = (CharData *)operator_new__(0x1000);
  (this->super_FFont).Chars = pCVar3;
  uVar1 = *(ushort *)(data + 4);
  uVar2 = *(ushort *)(data + 6);
  lVar5 = 0;
  this->FontType = FONT1;
  (this->super_FFont).FontHeight = (uint)uVar2;
  (this->super_FFont).SpaceWidth = (uint)uVar1;
  (this->super_FFont).FirstChar = 0;
  (this->super_FFont).LastChar = 0xff;
  (this->super_FFont).GlobalKerning = 0;
  pBVar4 = (BYTE *)operator_new__(0x100);
  (this->super_FFont).PatchRemap = pBVar4;
  do {
    *(undefined8 *)((long)&pCVar3->Pic + lVar5) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x1000);
  (*(this->super_FFont)._vptr_FFont[4])(this);
  return;
}

Assistant:

void FSingleLumpFont::LoadFON1 (int lump, const BYTE *data)
{
	int w, h;

	Chars = new CharData[256];

	w = data[4] + data[5]*256;
	h = data[6] + data[7]*256;

	FontType = FONT1;
	FontHeight = h;
	SpaceWidth = w;
	FirstChar = 0;
	LastChar = 255;
	GlobalKerning = 0;
	PatchRemap = new BYTE[256];

	for(unsigned int i = 0;i < 256;++i)
		Chars[i].Pic = NULL;

	LoadTranslations();
}